

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

void InitConformal(void)

{
  pointer pBVar1;
  int iVar2;
  int a;
  long lVar3;
  int b;
  long lVar4;
  int (*paiVar5) [512];
  Clifford local_c0;
  vector<Blade,_std::allocator<Blade>_> local_a8;
  vector<Blade,_std::allocator<Blade>_> local_90;
  Clifford local_78;
  vector<Blade,_std::allocator<Blade>_> local_60;
  vector<Blade,_std::allocator<Blade>_> local_48;
  
  tp = 4;
  tq = 1;
  dim = 0x20;
  Re = (float *)operator_new__(0x80);
  paiVar5 = signs;
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
      iVar2 = sign2((int)lVar3,(int)lVar4);
      (*paiVar5)[lVar4] = iVar2;
    }
    paiVar5 = paiVar5 + 1;
  }
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e0);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e1);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e2);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e3);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e4);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&Ie);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&E);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&Ic);
  pBVar1 = e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_c0,0);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e0,(const_iterator)pBVar1,(Blade *)&local_c0);
  Blade::~Blade((Blade *)&local_c0);
  pBVar1 = e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_c0,1);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e1,(const_iterator)pBVar1,(Blade *)&local_c0);
  Blade::~Blade((Blade *)&local_c0);
  pBVar1 = e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_c0,2);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e2,(const_iterator)pBVar1,(Blade *)&local_c0);
  Blade::~Blade((Blade *)&local_c0);
  pBVar1 = e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_c0,4);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e3,(const_iterator)pBVar1,(Blade *)&local_c0);
  Blade::~Blade((Blade *)&local_c0);
  pBVar1 = e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_c0,8);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e4,(const_iterator)pBVar1,(Blade *)&local_c0);
  Blade::~Blade((Blade *)&local_c0);
  pBVar1 = e5.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_c0,0x10);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e5,(const_iterator)pBVar1,(Blade *)&local_c0);
  Blade::~Blade((Blade *)&local_c0);
  pBVar1 = Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_c0,7);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&Ie,(const_iterator)pBVar1,(Blade *)&local_c0);
  Blade::~Blade((Blade *)&local_c0);
  pBVar1 = E.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_c0,0x18);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&E,(const_iterator)pBVar1,(Blade *)&local_c0);
  Blade::~Blade((Blade *)&local_c0);
  pBVar1 = Ic.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_c0,0x1f);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&Ic,(const_iterator)pBVar1,(Blade *)&local_c0);
  Blade::~Blade((Blade *)&local_c0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_48,&e4);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_60,&e5);
  operator+(&local_c0,&local_48,&local_60);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&e,&local_c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_60);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_48);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_90,&e5);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_a8,&e4);
  operator-(&local_78,&local_90,&local_a8);
  operator/(&local_c0,&local_78,2.0);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&eo,&local_c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_78);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_90);
  return;
}

Assistant:

void InitConformal()
{
	//dimention of algebra
	tp=4; tq=1;dim=(1<<(tp+tq));
	Re=new float[dim];

	for(int a=0;a<dim;a++)
	{
		for(int b=0;b<dim;b++)
		{
			signs[a][b]=sign2(a,b);	
		}
		
	}
	//init basis
	e0.clear();
	e1.clear();
	e2.clear();
	e3.clear();
	e4.clear();
	Ie.clear();
	 E.clear();
	Ic.clear();
	e0.insert(e0.begin(),Blade(0));
	e1.insert(e1.begin(),Blade(1));
	e2.insert(e2.begin(),Blade(2));
	e3.insert(e3.begin(),Blade(4));
	e4.insert(e4.begin(),Blade(8));
	e5.insert(e5.begin(),Blade(16));
	Ie.insert(Ie.begin(),Blade(7));
	 E.insert( E.begin(),Blade(24));
	Ic.insert(Ic.begin(),Blade(31));
	
	e=e4+e5;
	eo=(e5-e4)/2.0;



}